

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O0

void __thiscall chrono::turtlebot::Turtlebot_MiddlePlate::Initialize(Turtlebot_MiddlePlate *this)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  element_type *peVar3;
  ChFrame<double> *this_00;
  element_type *peVar4;
  shared_ptr<chrono::ChPhysicsItem> local_3b0;
  shared_ptr<chrono::collision::ChCollisionModel> local_3a0;
  shared_ptr<chrono::collision::ChCollisionModel> local_390;
  shared_ptr<chrono::collision::ChCollisionModel> local_380;
  undefined1 local_370 [8];
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  ChFrame<double> *X_GP;
  ChFrame<double> local_240;
  undefined1 local_1b8 [8];
  ChVector<double> principal_I;
  ChMatrix33<double> principal_inertia_rot;
  ChMatrix33<double> minertia;
  ChVector<double> mcog;
  double mmass;
  ChVector<double> local_a8;
  undefined1 local_90 [8];
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  string local_30 [8];
  string vis_mesh_file;
  Turtlebot_MiddlePlate *this_local;
  
  std::operator+((char *)local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "robot/turtlebot/");
  std::operator+(local_50,(char *)local_70);
  chrono::GetChronoDataFile(local_30);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string(local_70);
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)local_90,SUB81(local_30,0),false);
  peVar2 = std::
           __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
  ChVector<double>::ChVector(&local_a8,0.0,0.0,0.0);
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)&mmass,1.0);
  (**(code **)(*(long *)peVar2 + 0x80))(peVar2,&local_a8,&mmass);
  std::
  __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_90);
  chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
  ChVector<double>::ChVector
            ((ChVector<double> *)
             (minertia.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             8));
  ChMatrix33<double>::ChMatrix33
            ((ChMatrix33<double> *)
             (principal_inertia_rot.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             8));
  peVar2 = std::
           __shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
  chrono::geometry::ChTriangleMeshConnected::ComputeMassProperties
            (SUB81(peVar2,0),(double *)0x1,(ChVector *)(mcog.m_data + 2),
             (ChMatrix33 *)
             (minertia.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             8));
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)(principal_I.m_data + 2));
  ChVector<double>::ChVector((ChVector<double> *)local_1b8);
  ChInertiaUtils::PrincipalInertia
            ((ChMatrix33<double> *)
             (principal_inertia_rot.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             8),(ChVector<double> *)local_1b8,(ChMatrix33<double> *)(principal_I.m_data + 2));
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_Turtlebot_Part).m_body);
  ChFrame<double>::ChFrame
            (&local_240,
             (ChVector<double> *)
             (minertia.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
             8),(ChMatrix33<double> *)(principal_I.m_data + 2));
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF((ChFrame *)peVar3);
  ChFrame<double>::~ChFrame(&local_240);
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_Turtlebot_Part).m_body);
  ChBody::SetMass((ChBody *)peVar3,mcog.m_data[2] * (this->super_Turtlebot_Part).m_density);
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_Turtlebot_Part).m_body);
  chrono::operator*((ChVector<double> *)&X_GP,(this->super_Turtlebot_Part).m_density,
                    (ChVector<double> *)local_1b8);
  chrono::ChBody::SetInertiaXX(peVar3);
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_Turtlebot_Part).m_chassis);
  this_00 = (ChFrame<double> *)(**(code **)(*(long *)peVar3 + 0x1f0))();
  ChFrame<double>::ChFrame
            ((ChFrame<double> *)
             ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x40),&(this->super_Turtlebot_Part).m_pos,
             &(this->super_Turtlebot_Part).m_rot);
  ChFrame<double>::operator*
            ((ChFrame<double> *)local_370,this_00,
             (ChFrame<double> *)
             ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x40));
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_Turtlebot_Part).m_body);
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs((ChFrame *)peVar3);
  peVar3 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_Turtlebot_Part).m_body);
  chrono::ChBody::SetBodyFixed(SUB81(peVar3,0));
  Turtlebot_Part::AddCollisionShapes(&this->super_Turtlebot_Part);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_Turtlebot_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)&local_380);
  peVar4 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_380);
  (**(code **)(*(long *)peVar4 + 200))(peVar4,6);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_380);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_Turtlebot_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)&local_390);
  peVar4 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_390);
  (**(code **)(*(long *)peVar4 + 0xd8))(peVar4,4);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_390);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &(this->super_Turtlebot_Part).m_body);
  ChBody::GetCollisionModel((ChBody *)&local_3a0);
  peVar4 = std::
           __shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_3a0);
  (**(code **)(*(long *)peVar4 + 0xd8))(peVar4,1);
  std::shared_ptr<chrono::collision::ChCollisionModel>::~shared_ptr(&local_3a0);
  Turtlebot_Part::AddVisualizationAssets(&this->super_Turtlebot_Part);
  pCVar1 = (this->super_Turtlebot_Part).m_system;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChBodyAuxRef,void>
            (&local_3b0,&(this->super_Turtlebot_Part).m_body);
  chrono::ChSystem::Add(pCVar1,&local_3b0);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_3b0);
  ChFrame<double>::~ChFrame((ChFrame<double> *)local_370);
  ChFrame<double>::~ChFrame
            ((ChFrame<double> *)
             ((long)X_GC.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + 0x40));
  std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr
            ((shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)local_90);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Turtlebot_MiddlePlate::Initialize() {
    auto vis_mesh_file = GetChronoDataFile("robot/turtlebot/" + m_mesh_name + ".obj");
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, false, false);
    trimesh->Transform(ChVector<>(0, 0, 0), ChMatrix33<>(1));  // scale to a different size
    trimesh->RepairDuplicateVertexes(1e-9);                    // if meshes are not watertight

    double mmass;
    ChVector<> mcog;
    ChMatrix33<> minertia;
    trimesh->ComputeMassProperties(true, mmass, mcog, minertia);
    ChMatrix33<> principal_inertia_rot;
    ChVector<> principal_I;
    ChInertiaUtils::PrincipalInertia(minertia, principal_I, principal_inertia_rot);

    m_body->SetFrame_COG_to_REF(ChFrame<>(mcog, principal_inertia_rot));

    // Set inertia
    m_body->SetMass(mmass * m_density);
    m_body->SetInertiaXX(m_density * principal_I);

    // set relative position to chassis
    const ChFrame<>& X_GP = m_chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(m_pos, m_rot);                              // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                              // global -> child
    m_body->SetFrame_REF_to_abs(X_GC);
    m_body->SetBodyFixed(m_fixed);

    AddCollisionShapes();

    m_body->GetCollisionModel()->SetFamily(CollisionFamily::MIDDLE_PLATE);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::ROD);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::CHASSIS);

    AddVisualizationAssets();

    m_system->Add(m_body);
}